

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall Js::CompoundString::TakeOwnershipOfLastBlock(CompoundString *this)

{
  code *pcVar1;
  bool bVar2;
  CharCount usedCharLength;
  undefined4 *puVar3;
  Block **ppBVar4;
  JavascriptLibrary *pJVar5;
  Recycler *pRVar6;
  Block *pBVar7;
  Block *newLastBlock;
  Recycler *recycler;
  Block *lastBlock;
  CompoundString *this_local;
  
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c5,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = OwnsLastBlock(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3c6,"(!OwnsLastBlock())","!OwnsLastBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_Block__((WriteBarrierPtr *)&this->lastBlock);
  pBVar7 = *ppBVar4;
  if (pBVar7 == (Block *)0x0) {
    pJVar5 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    pRVar6 = JavascriptLibrary::GetRecycler(pJVar5);
    pBVar7 = BlockInfo::Resize(&this->lastBlockInfo,pRVar6);
    Memory::WriteBarrierPtr<Js::CompoundString::Block>::operator=(&this->lastBlock,pBVar7);
    this->ownsLastBlock = true;
  }
  else {
    pJVar5 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    pRVar6 = JavascriptLibrary::GetRecycler(pJVar5);
    usedCharLength = LastBlockCharLength(this);
    pBVar7 = Block::Clone(pBVar7,usedCharLength,pRVar6);
    pBVar7 = Block::Chain(pBVar7,pRVar6);
    BlockInfo::CopyFrom(&this->lastBlockInfo,pBVar7);
    this->ownsLastBlock = true;
    Memory::WriteBarrierPtr<Js::CompoundString::Block>::operator=(&this->lastBlock,pBVar7);
  }
  return;
}

Assistant:

void CompoundString::TakeOwnershipOfLastBlock()
    {
        Assert(!IsFinalized());
        Assert(!OwnsLastBlock());

        // Another string object owns the last block's buffer. The buffer must be copied, or another block must be chained.

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            ownsLastBlock = true;
            return;
        }

        // The last block is already in a chain, or is over the threshold to resize. Shallow-clone the last block (clone
        // just its metadata, while still pointing to the original buffer), and chain it to a new last block.
        Recycler *const recycler = GetLibrary()->GetRecycler();
        Block *const newLastBlock = lastBlock->Clone(LastBlockCharLength(), recycler)->Chain(recycler);
        lastBlockInfo.CopyFrom(newLastBlock);
        ownsLastBlock = true;
        this->lastBlock = newLastBlock;
    }